

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jmemmgr.c
# Opt level: O0

void free_pool(j_common_ptr cinfo,int pool_id)

{
  long lVar1;
  undefined8 *puVar2;
  long lVar3;
  long lVar4;
  jpeg_memory_mgr *pjVar5;
  jpeg_progress_mgr *pjVar6;
  int in_ESI;
  long *in_RDI;
  small_pool_ptr_conflict next_shdr_ptr;
  large_pool_ptr_conflict next_lhdr_ptr;
  jvirt_barray_ptr bptr;
  jvirt_sarray_ptr sptr;
  size_t space_freed;
  large_pool_ptr_conflict lhdr_ptr;
  small_pool_ptr_conflict shdr_ptr;
  my_mem_ptr mem;
  void *in_stack_ffffffffffffffa8;
  j_common_ptr in_stack_ffffffffffffffb0;
  jpeg_error_mgr *cinfo_00;
  long local_40;
  long local_38;
  undefined8 *local_28;
  j_common_ptr local_20;
  
  lVar1 = in_RDI[1];
  if ((in_ESI < 0) || (1 < in_ESI)) {
    *(undefined4 *)(*in_RDI + 0x28) = 0xf;
    *(int *)(*in_RDI + 0x2c) = in_ESI;
    (**(code **)*in_RDI)(in_RDI);
  }
  if (in_ESI == 1) {
    for (local_38 = *(long *)(lVar1 + 0x88); local_38 != 0; local_38 = *(long *)(local_38 + 0x30)) {
      if (*(int *)(local_38 + 0x2c) != 0) {
        *(undefined4 *)(local_38 + 0x2c) = 0;
        (**(code **)(local_38 + 0x48))(in_RDI,local_38 + 0x38);
      }
    }
    *(undefined8 *)(lVar1 + 0x88) = 0;
    for (local_40 = *(long *)(lVar1 + 0x90); local_40 != 0; local_40 = *(long *)(local_40 + 0x30)) {
      if (*(int *)(local_40 + 0x2c) != 0) {
        *(undefined4 *)(local_40 + 0x2c) = 0;
        (**(code **)(local_40 + 0x48))(in_RDI,local_40 + 0x38);
      }
    }
    *(undefined8 *)(lVar1 + 0x90) = 0;
  }
  local_28 = *(undefined8 **)(lVar1 + 0x78 + (long)in_ESI * 8);
  *(undefined8 *)(lVar1 + 0x78 + (long)in_ESI * 8) = 0;
  while (local_28 != (undefined8 *)0x0) {
    puVar2 = (undefined8 *)*local_28;
    lVar3 = local_28[1];
    lVar4 = local_28[2];
    jpeg_free_large(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,0x279ad5);
    *(long *)(lVar1 + 0x98) = *(long *)(lVar1 + 0x98) - (lVar3 + lVar4 + 0x18);
    local_28 = puVar2;
  }
  local_20 = *(j_common_ptr *)(lVar1 + 0x68 + (long)in_ESI * 8);
  *(undefined8 *)(lVar1 + 0x68 + (long)in_ESI * 8) = 0;
  while (local_20 != (j_common_ptr)0x0) {
    cinfo_00 = local_20->err;
    pjVar5 = local_20->mem;
    pjVar6 = local_20->progress;
    jpeg_free_small((j_common_ptr)cinfo_00,in_stack_ffffffffffffffa8,0x279b67);
    *(long *)(lVar1 + 0x98) =
         *(long *)(lVar1 + 0x98) - ((long)&pjVar6->completed_passes + (long)&pjVar5->alloc_small);
    local_20 = (j_common_ptr)cinfo_00;
  }
  return;
}

Assistant:

METHODDEF(void)
free_pool (j_common_ptr cinfo, int pool_id)
{
  my_mem_ptr mem = (my_mem_ptr) cinfo->mem;
  small_pool_ptr shdr_ptr;
  large_pool_ptr lhdr_ptr;
  size_t space_freed;

  if (pool_id < 0 || pool_id >= JPOOL_NUMPOOLS)
    ERREXIT1(cinfo, JERR_BAD_POOL_ID, pool_id);	/* safety check */

#ifdef MEM_STATS
  if (cinfo->err->trace_level > 1)
    print_mem_stats(cinfo, pool_id); /* print pool's memory usage statistics */
#endif

  /* If freeing IMAGE pool, close any virtual arrays first */
  if (pool_id == JPOOL_IMAGE) {
    jvirt_sarray_ptr sptr;
    jvirt_barray_ptr bptr;

    for (sptr = mem->virt_sarray_list; sptr != NULL; sptr = sptr->next) {
      if (sptr->b_s_open) {	/* there may be no backing store */
	sptr->b_s_open = FALSE;	/* prevent recursive close if error */
	(*sptr->b_s_info.close_backing_store) (cinfo, & sptr->b_s_info);
      }
    }
    mem->virt_sarray_list = NULL;
    for (bptr = mem->virt_barray_list; bptr != NULL; bptr = bptr->next) {
      if (bptr->b_s_open) {	/* there may be no backing store */
	bptr->b_s_open = FALSE;	/* prevent recursive close if error */
	(*bptr->b_s_info.close_backing_store) (cinfo, & bptr->b_s_info);
      }
    }
    mem->virt_barray_list = NULL;
  }

  /* Release large objects */
  lhdr_ptr = mem->large_list[pool_id];
  mem->large_list[pool_id] = NULL;

  while (lhdr_ptr != NULL) {
    large_pool_ptr next_lhdr_ptr = lhdr_ptr->hdr.next;
    space_freed = lhdr_ptr->hdr.bytes_used +
		  lhdr_ptr->hdr.bytes_left +
		  SIZEOF(large_pool_hdr);
    jpeg_free_large(cinfo, (void FAR *) lhdr_ptr, space_freed);
    mem->total_space_allocated -= space_freed;
    lhdr_ptr = next_lhdr_ptr;
  }

  /* Release small objects */
  shdr_ptr = mem->small_list[pool_id];
  mem->small_list[pool_id] = NULL;

  while (shdr_ptr != NULL) {
    small_pool_ptr next_shdr_ptr = shdr_ptr->hdr.next;
    space_freed = shdr_ptr->hdr.bytes_used +
		  shdr_ptr->hdr.bytes_left +
		  SIZEOF(small_pool_hdr);
    jpeg_free_small(cinfo, (void *) shdr_ptr, space_freed);
    mem->total_space_allocated -= space_freed;
    shdr_ptr = next_shdr_ptr;
  }
}